

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O1

bool Js::DateImplementation::TryParseTwoDecimalDigits
               (char16 *str,size_t length,size_t startIndex,int *value,bool canHaveTrailingDigit)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  byte bVar4;
  
  if (str == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x2ee,"(str)","str");
    if (!bVar2) goto LAB_00b4ca64;
    *puVar3 = 0;
  }
  if (length == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x2ef,"(length)","length");
    if (!bVar2) goto LAB_00b4ca64;
    *puVar3 = 0;
  }
  if (length < startIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x2f0,"(startIndex <= length)","startIndex <= length");
    if (!bVar2) {
LAB_00b4ca64:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (((length - startIndex < 2) || (9 < (ushort)(str[startIndex] + L'￐'))) ||
     (9 < (ushort)(str[startIndex + 1] + L'￐'))) {
    bVar4 = 0;
  }
  else {
    *value = (uint)(ushort)(str[startIndex + 1] + L'￐' + (str[startIndex] + L'￐') * 10);
    bVar2 = true;
    if (length - startIndex != 2) {
      bVar2 = (ushort)(str[startIndex + 2] + L'ￆ') < 0xfff6;
    }
    bVar4 = canHaveTrailingDigit | bVar2;
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool DateImplementation::TryParseTwoDecimalDigits(
        const char16 *const str,
        const size_t length,
        const size_t startIndex,
        int &value,
        bool canHaveTrailingDigit /* = false */)
    {
        Assert(str);
        Assert(length);
        Assert(startIndex <= length);

        if(length - startIndex < 2)
            return false;

        unsigned short d = str[startIndex] - _u('0');
        if(d > 9)
            return false;
        short v = d * 10;
        d = str[startIndex + 1] - _u('0');
        if(d > 9)
            return false;
        value = v + d;

        // The next character must not be a digit if canHaveTrailingDigit is false
        bool hasNoTrailingDigit = !(length - startIndex > 2 && static_cast<unsigned short>(str[startIndex + 2] - _u('0')) <= 9);
        return canHaveTrailingDigit || hasNoTrailingDigit;
    }